

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

CBlockIndex * __thiscall node::BlockManager::InsertBlockIndex(BlockManager *this,uint256 *hash)

{
  long lVar1;
  uint256 *puVar2;
  _Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> _Var3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>,_bool>
  pVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (uint256 *)
           std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (hash);
  if (puVar2 == hash + 1) {
    pCVar4 = (CBlockIndex *)0x0;
  }
  else {
    pVar5 = std::__detail::
            _Insert_base<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::try_emplace<uint256_const&>
                      ((_Insert_base<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->m_block_index,(const_iterator)0x0,hash);
    _Var3 = pVar5.first.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
            _M_cur;
    pCVar4 = (CBlockIndex *)
             ((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                    _M_cur + 0x28);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(long *)((long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                      _M_cur + 0x28) =
           (long)_Var3.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur
           + 8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar4;
  }
  __stack_chk_fail();
}

Assistant:

CBlockIndex* BlockManager::InsertBlockIndex(const uint256& hash)
{
    AssertLockHeld(cs_main);

    if (hash.IsNull()) {
        return nullptr;
    }

    const auto [mi, inserted]{m_block_index.try_emplace(hash)};
    CBlockIndex* pindex = &(*mi).second;
    if (inserted) {
        pindex->phashBlock = &((*mi).first);
    }
    return pindex;
}